

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang.cc
# Opt level: O2

Node __thiscall verona::typevar(verona *this,Location *loc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Node NVar1;
  Node NStack_68;
  undefined1 local_58 [16];
  Token local_48;
  Location local_40;
  
  trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_58);
  local_48.def = (TokenDef *)TypeVar;
  trieste::Location::Location(&local_40,loc);
  trieste::operator^((trieste *)&NStack_68,&local_48,&local_40);
  trieste::operator<<((trieste *)this,(Node *)local_58,&NStack_68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&NStack_68.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.source.super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  NVar1.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar1.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar1.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node typevar(Location loc)
  {
    return Type << (TypeVar ^ loc);
  }